

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int uv_fs_link(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,uv_fs_cb cb)

{
  long *plVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->type = UV_FS;
    req->active_queue[0] = loop->active_reqs;
    plVar1 = (long *)loop->active_reqs[1];
    req->active_queue[1] = plVar1;
    *plVar1 = (long)req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  req->fs_type = UV_FS_LINK;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  if (cb == (uv_fs_cb)0x0) {
    req->path = path;
    req->new_path = new_path;
  }
  else {
    sVar3 = strlen(path);
    sVar4 = strlen(new_path);
    __dest = (char *)uv__malloc(sVar4 + sVar3 + 2);
    req->path = __dest;
    if (__dest == (char *)0x0) {
      if (loop->active_reqs == (void **)loop->active_reqs[0]) {
        __assert_fail("uv__has_active_reqs(loop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/fs.c"
                      ,0x444,
                      "int uv_fs_link(uv_loop_t *, uv_fs_t *, const char *, const char *, uv_fs_cb)"
                     );
      }
      *(void **)req->active_queue[1] = req->active_queue[0];
      *(void **)((long)req->active_queue[0] + 8) = req->active_queue[1];
    }
    else {
      req->new_path = __dest + sVar3 + 1;
      memcpy(__dest,path,sVar3 + 1);
      memcpy(req->new_path,new_path,sVar4 + 1);
    }
    if (__dest == (char *)0x0) {
      return -0xc;
    }
  }
  if (cb == (uv_fs_cb)0x0) {
    uv__fs_work(&req->work_req);
    iVar2 = (int)req->result;
  }
  else {
    uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int uv_fs_link(uv_loop_t* loop,
               uv_fs_t* req,
               const char* path,
               const char* new_path,
               uv_fs_cb cb) {
  INIT(LINK);
  PATH2;
  POST;
}